

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS ref_node_deep_copy(REF_NODE *ref_node_ptr,REF_MPI ref_mpi,REF_NODE original)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  REF_GLOB *pRVar3;
  REF_INT *pRVar4;
  uint uVar5;
  REF_NODE pRVar6;
  REF_GLOB *pRVar7;
  REF_INT *pRVar8;
  REF_DBL *pRVar9;
  REF_DBL *pRVar10;
  ulong uVar11;
  ulong uVar12;
  undefined8 uVar13;
  ulong uVar14;
  long lVar15;
  char *pcVar16;
  
  pRVar6 = (REF_NODE)malloc(0xa0);
  *ref_node_ptr = pRVar6;
  if (pRVar6 == (REF_NODE)0x0) {
    pcVar16 = "malloc *ref_node_ptr of REF_NODE_STRUCT NULL";
    uVar13 = 0x6c;
  }
  else {
    uVar1 = original->max;
    uVar12 = (ulong)uVar1;
    pRVar6->n = original->n;
    pRVar6->max = uVar1;
    if ((int)uVar1 < 0) {
      pcVar16 = "malloc ref_node->global of REF_GLOB negative";
      uVar13 = 0x74;
LAB_0017047f:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar13
             ,"ref_node_deep_copy",pcVar16);
      return 1;
    }
    pRVar7 = (REF_GLOB *)malloc(uVar12 * 8);
    pRVar6->global = pRVar7;
    if (pRVar7 == (REF_GLOB *)0x0) {
      pcVar16 = "malloc ref_node->global of REF_GLOB NULL";
      uVar13 = 0x74;
    }
    else {
      pRVar6->blank = original->blank;
      if (uVar12 != 0) {
        pRVar3 = original->global;
        uVar11 = 0;
        do {
          pRVar7[uVar11] = pRVar3[uVar11];
          uVar11 = uVar11 + 1;
        } while (uVar12 != uVar11);
      }
      pRVar7 = (REF_GLOB *)malloc(uVar12 * 8);
      pRVar6->sorted_global = pRVar7;
      if (pRVar7 == (REF_GLOB *)0x0) {
        pcVar16 = "malloc ref_node->sorted_global of REF_GLOB NULL";
        uVar13 = 0x79;
      }
      else {
        __size = uVar12 * 4;
        pRVar8 = (REF_INT *)malloc(__size);
        pRVar6->sorted_local = pRVar8;
        if (pRVar8 == (REF_INT *)0x0) {
          pcVar16 = "malloc ref_node->sorted_local of REF_INT NULL";
          uVar13 = 0x7a;
        }
        else {
          if (uVar12 != 0) {
            pRVar3 = original->sorted_global;
            uVar11 = 1;
            if (1 < (int)uVar1) {
              uVar11 = (ulong)uVar1;
            }
            uVar14 = 0;
            do {
              pRVar7[uVar14] = pRVar3[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar11 != uVar14);
            pRVar4 = original->sorted_local;
            uVar11 = 1;
            if (1 < (int)uVar1) {
              uVar11 = (ulong)uVar1;
            }
            uVar14 = 0;
            do {
              pRVar8[uVar14] = pRVar4[uVar14];
              uVar14 = uVar14 + 1;
            } while (uVar11 != uVar14);
          }
          pRVar8 = (REF_INT *)malloc(__size);
          pRVar6->part = pRVar8;
          if (pRVar8 == (REF_INT *)0x0) {
            pcVar16 = "malloc ref_node->part of REF_INT NULL";
            uVar13 = 0x80;
          }
          else {
            if (uVar12 != 0) {
              pRVar4 = original->part;
              uVar11 = 1;
              if (1 < (int)uVar1) {
                uVar11 = (ulong)uVar1;
              }
              uVar14 = 0;
              do {
                pRVar8[uVar14] = pRVar4[uVar14];
                uVar14 = uVar14 + 1;
              } while (uVar11 != uVar14);
            }
            pRVar8 = (REF_INT *)malloc(__size);
            pRVar6->age = pRVar8;
            if (pRVar8 == (REF_INT *)0x0) {
              pcVar16 = "malloc ref_node->age of REF_INT NULL";
              uVar13 = 0x84;
            }
            else {
              if (uVar12 != 0) {
                pRVar4 = original->age;
                uVar11 = 1;
                if (1 < (int)uVar1) {
                  uVar11 = (ulong)uVar1;
                }
                uVar14 = 0;
                do {
                  pRVar8[uVar14] = pRVar4[uVar14];
                  uVar14 = uVar14 + 1;
                } while (uVar11 != uVar14);
              }
              pRVar9 = (REF_DBL *)malloc(uVar12 * 0x78);
              pRVar6->real = pRVar9;
              if (pRVar9 == (REF_DBL *)0x0) {
                pcVar16 = "malloc ref_node->real of REF_DBL NULL";
                uVar13 = 0x88;
              }
              else {
                if (uVar12 != 0) {
                  pRVar10 = original->real;
                  uVar11 = 1;
                  if (1 < (int)uVar1) {
                    uVar11 = (ulong)uVar1;
                  }
                  uVar14 = 0;
                  do {
                    lVar15 = 0;
                    do {
                      pRVar9[lVar15] = pRVar10[lVar15];
                      lVar15 = lVar15 + 1;
                    } while (lVar15 != 0xf);
                    uVar14 = uVar14 + 1;
                    pRVar9 = pRVar9 + 0xf;
                    pRVar10 = pRVar10 + 0xf;
                  } while (uVar14 != uVar11);
                }
                iVar2 = original->naux;
                pRVar6->naux = iVar2;
                pRVar6->aux = (REF_DBL *)0x0;
                if (0 < iVar2) {
                  fflush(_stdout);
                  uVar5 = pRVar6->max * pRVar6->naux;
                  if (0 < (int)uVar5) {
                    pRVar9 = (REF_DBL *)realloc(pRVar6->aux,(ulong)uVar5 << 3);
                    pRVar6->aux = pRVar9;
                  }
                  pRVar9 = pRVar6->aux;
                  if (pRVar9 == (REF_DBL *)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0x91,"ref_node_deep_copy","realloc ref_node->aux NULL");
                    uVar12 = (long)pRVar6->max * (long)pRVar6->naux;
                    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
                           uVar12 & 0xffffffff,uVar12,8,uVar12 * 8);
                    return 2;
                  }
                  if (uVar12 != 0) {
                    uVar5 = pRVar6->naux;
                    uVar12 = 1;
                    if (1 < (int)uVar1) {
                      uVar12 = (ulong)uVar1;
                    }
                    lVar15 = 0;
                    uVar11 = 0;
                    do {
                      if (0 < (int)uVar5) {
                        iVar2 = original->naux;
                        pRVar10 = original->aux;
                        uVar14 = 0;
                        do {
                          pRVar9[uVar14] = *(REF_DBL *)((long)pRVar10 + uVar14 * 8 + iVar2 * lVar15)
                          ;
                          uVar14 = uVar14 + 1;
                        } while (uVar5 != uVar14);
                      }
                      uVar11 = uVar11 + 1;
                      pRVar9 = pRVar9 + (int)uVar5;
                      lVar15 = lVar15 + 8;
                    } while (uVar11 != uVar12);
                  }
                }
                pRVar6->ref_mpi = ref_mpi;
                uVar1 = original->n_unused;
                pRVar6->n_unused = uVar1;
                iVar2 = original->max_unused;
                pRVar6->max_unused = iVar2;
                if ((long)iVar2 < 0) {
                  pcVar16 = "malloc ref_node->unused_global of REF_GLOB negative";
                  uVar13 = 0x9b;
                  goto LAB_0017047f;
                }
                pRVar7 = (REF_GLOB *)malloc((long)iVar2 << 3);
                pRVar6->unused_global = pRVar7;
                if (pRVar7 != (REF_GLOB *)0x0) {
                  if (0 < (int)uVar1) {
                    pRVar3 = original->unused_global;
                    uVar12 = 0;
                    do {
                      pRVar7[uVar12] = pRVar3[uVar12];
                      uVar12 = uVar12 + 1;
                    } while (uVar1 != uVar12);
                  }
                  pRVar6->old_n_global = original->old_n_global;
                  pRVar6->new_n_global = original->new_n_global;
                  pRVar6->min_volume = original->min_volume;
                  pRVar6->min_uv_area = original->min_uv_area;
                  pRVar6->same_normal_tol = original->same_normal_tol;
                  pRVar6->tet_quality = original->tet_quality;
                  pRVar6->tri_quality = original->tri_quality;
                  pRVar6->ratio_method = original->ratio_method;
                  return 0;
                }
                pcVar16 = "malloc ref_node->unused_global of REF_GLOB NULL";
                uVar13 = 0x9b;
              }
            }
          }
        }
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar13,
         "ref_node_deep_copy",pcVar16);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_node_deep_copy(REF_NODE *ref_node_ptr, REF_MPI ref_mpi,
                                      REF_NODE original) {
  REF_INT max, node, i;
  REF_NODE ref_node;

  ref_malloc(*ref_node_ptr, 1, REF_NODE_STRUCT);
  ref_node = *ref_node_ptr;

  max = ref_node_max(original);

  ref_node_n(ref_node) = ref_node_n(original);
  ref_node_max(ref_node) = max;

  ref_malloc(ref_node->global, max, REF_GLOB);
  ref_node->blank = original->blank;
  for (node = 0; node < max; node++)
    ref_node->global[node] = original->global[node];

  ref_malloc(ref_node->sorted_global, max, REF_GLOB);
  ref_malloc(ref_node->sorted_local, max, REF_INT);
  for (node = 0; node < max; node++)
    ref_node->sorted_global[node] = original->sorted_global[node];
  for (node = 0; node < max; node++)
    ref_node->sorted_local[node] = original->sorted_local[node];

  ref_malloc(ref_node->part, max, REF_INT);
  for (node = 0; node < max; node++)
    ref_node_part(ref_node, node) = ref_node_part(original, node);

  ref_malloc(ref_node->age, max, REF_INT);
  for (node = 0; node < max; node++)
    ref_node_age(ref_node, node) = ref_node_age(original, node);

  ref_malloc(ref_node->real, REF_NODE_REAL_PER * max, REF_DBL);
  for (node = 0; node < max; node++)
    for (i = 0; i < REF_NODE_REAL_PER; i++)
      ref_node_real(ref_node, i, node) = ref_node_real(original, i, node);

  ref_node_naux(ref_node) = ref_node_naux(original);
  ref_node->aux = NULL;
  if (ref_node_naux(original) > 0) {
    ref_realloc(ref_node->aux, ref_node_naux(ref_node) * ref_node_max(ref_node),
                REF_DBL);
    for (node = 0; node < max; node++)
      for (i = 0; i < ref_node_naux(ref_node); i++)
        ref_node_aux(ref_node, i, node) = ref_node_aux(original, i, node);
  }

  ref_node_mpi(ref_node) = ref_mpi; /* reference only */

  ref_node->n_unused = original->n_unused;
  ref_node->max_unused = original->max_unused;
  ref_malloc(ref_node->unused_global, ref_node_max_unused(ref_node), REF_GLOB);
  for (i = 0; i < ref_node_n_unused(ref_node); i++)
    ref_node->unused_global[i] = original->unused_global[i];

  ref_node->old_n_global = original->old_n_global;
  ref_node->new_n_global = original->new_n_global;

  ref_node->min_volume = original->min_volume;
  ref_node->min_uv_area = original->min_uv_area;
  ref_node->same_normal_tol = original->same_normal_tol;

  ref_node->tet_quality = original->tet_quality;
  ref_node->tri_quality = original->tri_quality;
  ref_node->ratio_method = original->ratio_method;

  return REF_SUCCESS;
}